

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

QPointF __thiscall QWidget::mapTo(QWidget *this,QWidget *parent,QPointF *pos)

{
  QPointF QVar1;
  QWidget *pos_00;
  QWidget *in_RDX;
  QWidget *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QWidget *w;
  QPointF p;
  char *in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff84;
  char *in_stack_ffffffffffffff88;
  char local_48 [32];
  QPointF local_28;
  qreal local_18;
  qreal local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = *(qreal *)in_RDX;
  local_10 = *(qreal *)&in_RDX->field_0x8;
  pos_00 = in_RDI;
  if (in_RSI != (QWidget *)0x0) {
    do {
      if (pos_00 == in_RSI) goto LAB_0036bf27;
      local_28 = mapToParent(in_RDX,(QPointF *)pos_00);
      local_18 = local_28.xp;
      local_10 = local_28.yp;
      pos_00 = parentWidget((QWidget *)0x36beee);
    } while (pos_00 != (QWidget *)0x0);
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_RDI,in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
               in_stack_ffffffffffffff78);
    QMessageLogger::warning(local_48,"QWidget::mapTo(): parent must be in parent hierarchy");
  }
LAB_0036bf27:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  QVar1.yp = local_10;
  QVar1.xp = local_18;
  return QVar1;
}

Assistant:

QPointF QWidget::mapTo(const QWidget *parent, const QPointF &pos) const
{
    QPointF p = pos;
    if (parent) {
        const QWidget * w = this;
        while (w != parent) {
            p = w->mapToParent(p);
            w = w->parentWidget();
            if (!w) {
                qWarning("QWidget::mapTo(): parent must be in parent hierarchy");
                break;
            }
        }
    }
    return p;
}